

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2Dgridsearch.cpp
# Opt level: O0

bool __thiscall
SBPL2DGridSearch::search_exp
          (SBPL2DGridSearch *this,uchar **Grid2D,uchar obsthresh,int startx_c,int starty_c,
          int goalx_c,int goaly_c)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  int x;
  int y;
  int iVar6;
  char *what_arg;
  int in_ECX;
  byte in_DL;
  uchar **in_RSI;
  SBPL2DGridSearch *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int cost;
  int mapcost;
  int newy;
  int newx;
  int dir;
  int exp_y;
  int exp_x;
  clock_t starttime;
  CList OPEN2DLIST;
  int numofExpands;
  SBPL_2DGridSearchState *searchPredState;
  SBPL_2DGridSearchState *searchExpState;
  AbstractSearchState *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  uint local_c8;
  uint local_bc;
  byte local_b2;
  uint local_88;
  int local_7c;
  CList local_58;
  int local_3c;
  SBPL_2DGridSearchState *local_38;
  SBPL_2DGridSearchState *local_30;
  int local_28;
  int local_24;
  int local_20;
  byte local_19;
  uchar **local_18;
  byte local_1;
  
  local_30 = (SBPL_2DGridSearchState *)0x0;
  local_38 = (SBPL_2DGridSearchState *)0x0;
  local_3c = 0;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_20 = in_ECX;
  local_19 = in_DL;
  local_18 = in_RSI;
  CList::CList(&local_58);
  clock();
  in_RDI->iteration_ = in_RDI->iteration_ + 1;
  in_RDI->startX_ = local_20;
  in_RDI->startY_ = local_24;
  in_RDI->goalX_ = local_28;
  in_RDI->goalY_ = in_stack_00000008;
  bVar3 = withinMap(in_RDI,local_20,local_24);
  if ((bVar3) && (bVar3 = withinMap(in_RDI,local_28,in_stack_00000008), bVar3)) {
    local_30 = in_RDI->searchStates2D_[in_RDI->startX_] + in_RDI->startY_;
    initializeSearchState2D(in_RDI,local_30);
    local_30->g = 0;
    (local_30->super_AbstractSearchState).listelem[0] = (listelement *)0x0;
    CList::insertinfront
              ((CList *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28,0);
    while (bVar3 = CList::empty(&local_58), ((bVar3 ^ 0xffU) & 1) != 0) {
      local_30 = (SBPL_2DGridSearchState *)CList::getlast(&local_58);
      CList::remove(&local_58,(char *)local_30);
      local_3c = local_3c + 1;
      iVar1 = local_30->x;
      iVar2 = local_30->y;
      for (local_7c = 0; local_7c < 0x10; local_7c = local_7c + 1) {
        x = iVar1 + in_RDI->dx_[local_7c];
        y = iVar2 + in_RDI->dy_[local_7c];
        bVar3 = withinMap(in_RDI,x,y);
        if (bVar3) {
          bVar4 = (*in_RDI->getCost)(local_18,x,y,in_RDI->downsample_);
          bVar5 = (*in_RDI->getCost)(local_18,iVar1,iVar2,in_RDI->downsample_);
          if (bVar5 < bVar4) {
            local_b2 = (*in_RDI->getCost)(local_18,x,y,in_RDI->downsample_);
          }
          else {
            local_b2 = (*in_RDI->getCost)(local_18,iVar1,iVar2,in_RDI->downsample_);
          }
          local_bc = (uint)local_b2;
          local_88 = local_bc;
          if (7 < local_7c) {
            bVar4 = (*in_RDI->getCost)(local_18,iVar1 + in_RDI->dx0intersects_[local_7c],
                                       iVar2 + in_RDI->dy0intersects_[local_7c],in_RDI->downsample_)
            ;
            if (local_bc <= bVar4) {
              bVar4 = (*in_RDI->getCost)(local_18,iVar1 + in_RDI->dx0intersects_[local_7c],
                                         iVar2 + in_RDI->dy0intersects_[local_7c],
                                         in_RDI->downsample_);
              local_bc = (uint)bVar4;
            }
            bVar4 = (*in_RDI->getCost)(local_18,iVar1 + in_RDI->dx1intersects_[local_7c],
                                       iVar2 + in_RDI->dy1intersects_[local_7c],in_RDI->downsample_)
            ;
            if (bVar4 < local_bc) {
              local_c8 = local_bc;
            }
            else {
              bVar4 = (*in_RDI->getCost)(local_18,iVar1 + in_RDI->dx1intersects_[local_7c],
                                         iVar2 + in_RDI->dy1intersects_[local_7c],
                                         in_RDI->downsample_);
              in_stack_ffffffffffffff34 = CONCAT13(bVar4,(int3)in_stack_ffffffffffffff34);
              local_c8 = (uint)bVar4;
            }
            local_88 = local_c8;
          }
          if (local_88 < local_19) {
            iVar6 = (local_88 + 1) * in_RDI->dxy_distance_mm_[local_7c];
            local_38 = in_RDI->searchStates2D_[x] + y;
            if (local_38->iterationaccessed != in_RDI->iteration_) {
              (local_38->super_AbstractSearchState).listelem[0] = (listelement *)0x0;
            }
            if ((local_38->iterationaccessed != in_RDI->iteration_) ||
               (iVar6 + local_30->g < local_38->g)) {
              local_38->iterationaccessed = in_RDI->iteration_;
              if (iVar6 + local_30->g < 1000000000) {
                iVar6 = iVar6 + local_30->g;
              }
              else {
                iVar6 = 1000000000;
              }
              local_38->g = iVar6;
              if (999999999 < local_38->g) {
                what_arg = (char *)__cxa_allocate_exception(0x10);
                SBPL_Exception::SBPL_Exception
                          ((SBPL_Exception *)CONCAT44(in_stack_ffffffffffffff34,iVar6),what_arg);
                __cxa_throw(what_arg,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
              }
              if ((local_38->super_AbstractSearchState).listelem[0] == (listelement *)0x0) {
                CList::insertinfront
                          ((CList *)CONCAT44(in_stack_ffffffffffffff34,iVar6),
                           in_stack_ffffffffffffff28,0);
              }
            }
          }
        }
      }
    }
    in_RDI->largestcomputedoptf_ = 1000000000;
  }
  local_1 = 0;
  CList::~CList(&local_58);
  return (bool)(local_1 & 1);
}

Assistant:

bool SBPL2DGridSearch::search_exp(unsigned char** Grid2D, unsigned char obsthresh, int startx_c, int starty_c,
                                  int goalx_c, int goaly_c)
{
    SBPL_2DGridSearchState *searchExpState = NULL;
    SBPL_2DGridSearchState *searchPredState = NULL;
    int numofExpands = 0;
    CList OPEN2DLIST;

    //get the current time
    clock_t starttime = clock();

    //closed = 0
    iteration_++;

    //init start and goal coordinates
    startX_ = startx_c;
    startY_ = starty_c;
    goalX_ = goalx_c;
    goalY_ = goaly_c;

    //check the validity of start/goal
    if (!withinMap(startx_c, starty_c) || !withinMap(goalx_c, goaly_c)) {
        SBPL_ERROR("ERROR: grid2Dsearch is called on invalid start (%d %d) or goal(%d %d)\n", startx_c, starty_c,
                   goalx_c, goaly_c);
        return false;
    }

    // initialize the start and goal states
    searchExpState = &searchStates2D_[startX_][startY_];
    initializeSearchState2D(searchExpState);
    //no initialization for the goal state - it will reset iteration_ variable

    //seed the search
    searchExpState->g = 0;
    searchExpState->listelem[SBPL_2DSEARCH_OPEN_LIST_ID] = NULL;
    OPEN2DLIST.insertinfront(searchExpState, SBPL_2DSEARCH_OPEN_LIST_ID);

    //the main repetition of expansions
    while (!OPEN2DLIST.empty()) {
        //get the next state for expansion
        searchExpState = (SBPL_2DGridSearchState*)OPEN2DLIST.getlast();
        OPEN2DLIST.remove(searchExpState, SBPL_2DSEARCH_OPEN_LIST_ID);
        numofExpands++;

        int exp_x = searchExpState->x;
        int exp_y = searchExpState->y;

        //iterate over successors
        for (int dir = 0; dir < SBPL_2DGRIDSEARCH_NUMOF2DDIRS; dir++) {
            int newx = exp_x + dx_[dir];
            int newy = exp_y + dy_[dir];

            //make sure it is inside the map and has no obstacle
            if (!withinMap(newx, newy)) continue;

            //compute the cost
            int mapcost = __max( getCost(Grid2D, newx, newy, downsample_), getCost(Grid2D, exp_x, exp_y, downsample_));

#if SBPL_2DGRIDSEARCH_NUMOF2DDIRS > 8
            if(dir > 7) {
                //check two more cells through which the action goes
                mapcost = __max(mapcost, getCost(Grid2D, exp_x + dx0intersects_[dir], exp_y + dy0intersects_[dir], downsample_));
                mapcost = __max(mapcost, getCost(Grid2D, exp_x + dx1intersects_[dir], exp_y + dy1intersects_[dir], downsample_));
            }
#endif

            if (mapcost >= obsthresh) //obstacle encountered
            continue;
            int cost = (mapcost + 1) * dxy_distance_mm_[dir];

            //get the predecessor
            searchPredState = &searchStates2D_[newx][newy];

            //clear the list
            if (searchPredState->iterationaccessed != iteration_) searchPredState->listelem[SBPL_2DSEARCH_OPEN_LIST_ID]
                = NULL;

            //update predecessor if necessary
            if (searchPredState->iterationaccessed != iteration_ || searchPredState->g > cost + searchExpState->g) {
                searchPredState->iterationaccessed = iteration_;
                searchPredState->g = __min(INFINITECOST, cost + searchExpState->g);

                if (searchPredState->g >= INFINITECOST) {
                    throw SBPL_Exception("ERROR: infinite g");
                }

                //put it into the list if not there already
                if (searchPredState->listelem[SBPL_2DSEARCH_OPEN_LIST_ID] == NULL)
                    OPEN2DLIST.insertinfront(searchPredState, SBPL_2DSEARCH_OPEN_LIST_ID);
                //otherwise, the state remains where it is but it now has a new g-value
            }
        } //over successors
    }//while

    //set lower bounds for the remaining states - none left since we exhausted the whole list
    largestcomputedoptf_ = INFINITECOST;

    SBPL_PRINTF( "# of expands during 2dgridsearch=%d time=%d msecs 2Dsolcost_inmm=%d "
                "largestoptfval=%d (start=%d %d goal=%d %d)\n",
                numofExpands, (int)(((clock() - starttime) / (double)CLOCKS_PER_SEC) * 1000),
                searchStates2D_[goalx_c][goaly_c].g, largestcomputedoptf_, startx_c, starty_c, goalx_c, goaly_c);

    return false;
}